

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<capnp::compiler::CompilerMain::SourceFile>::setCapacity
          (Vector<capnp::compiler::CompilerMain::SourceFile> *this,size_t newSize)

{
  SourceFile *pSVar1;
  ArrayBuilder<capnp::compiler::CompilerMain::SourceFile> newBuilder;
  
  pSVar1 = (this->builder).ptr;
  if (newSize < (ulong)(((long)(this->builder).pos - (long)pSVar1) / 0x38)) {
    (this->builder).pos = pSVar1 + newSize;
  }
  newBuilder.ptr =
       kj::_::HeapArrayDisposer::allocateUninitialized<capnp::compiler::CompilerMain::SourceFile>
                 (newSize);
  newBuilder.endPtr = newBuilder.ptr + newSize;
  newBuilder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  newBuilder.pos = newBuilder.ptr;
  ArrayBuilder<capnp::compiler::CompilerMain::SourceFile>::
  addAll<kj::ArrayBuilder<capnp::compiler::CompilerMain::SourceFile>>(&newBuilder,&this->builder);
  ArrayBuilder<capnp::compiler::CompilerMain::SourceFile>::operator=(&this->builder,&newBuilder);
  ArrayBuilder<capnp::compiler::CompilerMain::SourceFile>::dispose(&newBuilder);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }